

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_objectmodel.h
# Opt level: O2

int __thiscall FlatNode::pathIndex(FlatNode *this,QString *filepath)

{
  int iVar1;
  qsizetype qVar2;
  qsizetype qVar3;
  int iVar4;
  int iVar5;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QString::QString((QString *)&local_40,"\\");
  qVar2 = QString::lastIndexOf(filepath,(QString *)&local_40,CaseSensitive);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  QString::QString((QString *)&local_40,"/");
  qVar3 = QString::lastIndexOf(filepath,(QString *)&local_40,CaseSensitive);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  iVar5 = (int)qVar2;
  iVar4 = (int)qVar3;
  iVar1 = iVar4;
  if (iVar4 < iVar5) {
    iVar1 = iVar5;
  }
  if (iVar4 == -1) {
    iVar1 = iVar5;
  }
  if (iVar5 == -1) {
    iVar1 = iVar4;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int pathIndex(const QString &filepath) {
        int Windex = filepath.lastIndexOf("\\");
        int Uindex = filepath.lastIndexOf("/");
        if (Windex != -1 && Uindex != -1)
            return qMax(Windex, Uindex);
        else if (Windex != -1)
            return Windex;
        return Uindex;
    }